

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::syntax::SyntaxNode_*>::reallocateTo
          (SmallVectorBase<slang::syntax::SyntaxNode_*> *this,size_type newCapacity)

{
  SyntaxNode **__last;
  EVP_PKEY_CTX *ctx;
  SyntaxNode **in_RSI;
  SmallVectorBase<slang::syntax::SyntaxNode_*> *in_RDI;
  pointer newData;
  
  __last = (SyntaxNode **)operator_new(0x285a56);
  begin(in_RDI);
  ctx = (EVP_PKEY_CTX *)end(in_RDI);
  std::uninitialized_move<slang::syntax::SyntaxNode**,slang::syntax::SyntaxNode**>
            (in_RSI,__last,(SyntaxNode **)in_RDI);
  cleanup(in_RDI,ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }